

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O0

void __thiscall Psbt_SetGlobalRecordTest_Test::TestBody(Psbt_SetGlobalRecordTest_Test *this)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  size_type sVar4;
  char *in_R9;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> key_list;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  ByteData get_gval2;
  ByteData get_gval1;
  Psbt psbt2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  ByteData global_value2;
  ByteData global_key2;
  ByteData global_value1;
  ByteData global_key1;
  Psbt psbt;
  Transaction tx;
  bool *in_stack_fffffffffffff908;
  undefined7 in_stack_fffffffffffff910;
  undefined1 in_stack_fffffffffffff917;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff918;
  undefined7 in_stack_fffffffffffff920;
  undefined1 in_stack_fffffffffffff927;
  char *in_stack_fffffffffffff928;
  AssertHelper local_650;
  Message local_648;
  string local_640 [32];
  string local_620 [32];
  AssertionResult local_600;
  AssertHelper local_5f0;
  Message local_5e8;
  string local_5e0 [32];
  string local_5c0 [32];
  AssertionResult local_5a0;
  AssertHelper local_590;
  Message local_588;
  size_type local_580;
  undefined4 local_574;
  AssertionResult local_570;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_560;
  AssertHelper local_548;
  Message local_540;
  string local_538 [32];
  string local_518 [32];
  AssertionResult local_4f8;
  AssertHelper local_4e8;
  Message local_4e0;
  string local_4d8 [32];
  string local_4b8 [32];
  AssertionResult local_498;
  ByteData local_488;
  ByteData local_470;
  ByteData local_458;
  Psbt local_440;
  AssertHelper local_3c0;
  Message local_3b8;
  string local_3b0 [32];
  AssertionResult local_390;
  AssertHelper local_380;
  Message local_378 [4];
  string local_358 [32];
  AssertionResult local_338;
  string local_328;
  AssertHelper local_308;
  Message local_300;
  byte local_2f1;
  AssertionResult local_2f0;
  string local_2e0;
  AssertHelper local_2c0;
  Message local_2b8;
  byte local_2a9;
  AssertionResult local_2a8;
  string local_298;
  AssertHelper local_278;
  Message local_270;
  byte local_261;
  AssertionResult local_260;
  allocator local_249;
  string local_248 [32];
  ByteData local_228;
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [32];
  ByteData local_1c0;
  allocator local_1a1;
  string local_1a0 [32];
  ByteData local_180;
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [32];
  ByteData local_118;
  Psbt local_100;
  allocator local_69;
  string local_68 [32];
  Transaction local_48 [72];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_68,
             "0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000"
             ,&local_69);
  cfd::core::Transaction::Transaction(local_48,local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  cfd::Psbt::Psbt(&local_100,local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"cfd",&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"dummy1",&local_161);
  cfd::core::Psbt::CreateRecordKey((uchar)&local_118,(string *)0xfc,(uchar)local_138,(string *)0x0);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"01020304",&local_1a1);
  cfd::core::ByteData::ByteData(&local_180,local_1a0);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"cfd",&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"dummy2",&local_209);
  cfd::core::Psbt::CreateRecordKey((uchar)&local_1c0,(string *)0xfc,(uchar)local_1e0,(string *)0x0);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"00",&local_249);
  cfd::core::ByteData::ByteData(&local_228,local_248);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  cfd::core::Psbt::SetGlobalRecord((ByteData *)&local_100,&local_118);
  local_261 = cfd::core::Psbt::IsFindGlobalRecord((ByteData *)&local_100);
  local_261 = local_261 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
             in_stack_fffffffffffff908,(type *)0x263856);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_260);
  if (!bVar1) {
    testing::Message::Message(&local_270);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_298,(internal *)&local_260,
               (AssertionResult *)"psbt.IsFindGlobalRecord(global_key1)","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x4e0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_278,&local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    std::__cxx11::string::~string((string *)&local_298);
    testing::Message::~Message((Message *)0x263b3e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x263bb6);
  bVar2 = cfd::core::Psbt::IsFindGlobalRecord((ByteData *)&local_100);
  local_2a9 = ~bVar2 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
             in_stack_fffffffffffff908,(type *)0x263bf9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a8);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2e0,(internal *)&local_2a8,
               (AssertionResult *)"psbt.IsFindGlobalRecord(global_key2)","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x4e1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    std::__cxx11::string::~string((string *)&local_2e0);
    testing::Message::~Message((Message *)0x263cf1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x263d6c);
  cfd::core::Psbt::SetGlobalRecord((ByteData *)&local_100,&local_1c0);
  local_2f1 = cfd::core::Psbt::IsFindGlobalRecord((ByteData *)&local_100);
  local_2f1 = local_2f1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
             in_stack_fffffffffffff908,(type *)0x263dcc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f0);
  if (!bVar1) {
    testing::Message::Message(&local_300);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_328,(internal *)&local_2f0,
               (AssertionResult *)"psbt.IsFindGlobalRecord(global_key2)","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x4e3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_308,&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    std::__cxx11::string::~string((string *)&local_328);
    testing::Message::~Message((Message *)0x263ec4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x263f3f);
  cfd::core::Psbt::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_338,
             "\"70736274ff01009a0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000dfc03636664000664756d6d793104010203040dfc03636664000664756d6d793201000000000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01009a0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000dfc03636664000664756d6d793104010203040dfc03636664000664756d6d793201000000000000"
             ,pcVar3);
  std::__cxx11::string::~string(local_358);
  cfd::core::ByteData::~ByteData((ByteData *)0x263fbb);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_338);
  if (!bVar1) {
    testing::Message::Message(local_378);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x26406d);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x4e5,pcVar3);
    testing::internal::AssertHelper::operator=(&local_380,local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    testing::Message::~Message((Message *)0x2640ca);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x264122);
  cfd::core::Psbt::GetBase64_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_390,
             "\"cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAAAAAAA==\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAAAAAAA=="
             ,pcVar3);
  std::__cxx11::string::~string(local_3b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_390);
  if (!bVar1) {
    testing::Message::Message(&local_3b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x264209);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x4e6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    testing::Message::~Message((Message *)0x264266);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2642be);
  cfd::core::Psbt::GetData();
  cfd::Psbt::Psbt(&local_440,&local_458);
  cfd::core::ByteData::~ByteData((ByteData *)0x2642f9);
  cfd::core::Psbt::GetGlobalRecord(&local_470);
  cfd::core::Psbt::GetGlobalRecord(&local_488);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffff928,
             (char *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
             in_stack_fffffffffffff918,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
  std::__cxx11::string::~string(local_4d8);
  std::__cxx11::string::~string(local_4b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_498);
  if (!bVar1) {
    testing::Message::Message(&local_4e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2644d2);
    testing::internal::AssertHelper::AssertHelper
              (&local_4e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x4eb,pcVar3);
    testing::internal::AssertHelper::operator=(&local_4e8,&local_4e0);
    testing::internal::AssertHelper::~AssertHelper(&local_4e8);
    testing::Message::~Message((Message *)0x26452f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x264587);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffff928,
             (char *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
             in_stack_fffffffffffff918,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
  std::__cxx11::string::~string(local_538);
  std::__cxx11::string::~string(local_518);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4f8);
  if (!bVar1) {
    testing::Message::Message(&local_540);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2646ae);
    testing::internal::AssertHelper::AssertHelper
              (&local_548,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x4ec,pcVar3);
    testing::internal::AssertHelper::operator=(&local_548,&local_540);
    testing::internal::AssertHelper::~AssertHelper(&local_548);
    testing::Message::~Message((Message *)0x26470b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x264763);
  cfd::core::Psbt::GetGlobalRecordKeyList();
  local_574 = 2;
  local_580 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                        (&local_560);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            (in_stack_fffffffffffff928,
             (char *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
             (int *)in_stack_fffffffffffff918,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_570);
  if (!bVar1) {
    testing::Message::Message(&local_588);
    in_stack_fffffffffffff928 =
         testing::AssertionResult::failure_message((AssertionResult *)0x264849);
    testing::internal::AssertHelper::AssertHelper
              (&local_590,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x4ef,in_stack_fffffffffffff928);
    testing::internal::AssertHelper::operator=(&local_590,&local_588);
    testing::internal::AssertHelper::~AssertHelper(&local_590);
    testing::Message::~Message((Message *)0x2648a6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2648fe);
  sVar4 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size(&local_560);
  if (sVar4 == 2) {
    cfd::core::ByteData::GetHex_abi_cxx11_();
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[](&local_560,0)
    ;
    cfd::core::ByteData::GetHex_abi_cxx11_();
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              (in_stack_fffffffffffff928,
               (char *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               in_stack_fffffffffffff918,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
    std::__cxx11::string::~string(local_5e0);
    std::__cxx11::string::~string(local_5c0);
    in_stack_fffffffffffff927 = testing::AssertionResult::operator_cast_to_bool(&local_5a0);
    if (!(bool)in_stack_fffffffffffff927) {
      testing::Message::Message(&local_5e8);
      in_stack_fffffffffffff918 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           testing::AssertionResult::failure_message((AssertionResult *)0x264a48);
      testing::internal::AssertHelper::AssertHelper
                (&local_5f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x4f1,(char *)in_stack_fffffffffffff918);
      testing::internal::AssertHelper::operator=(&local_5f0,&local_5e8);
      testing::internal::AssertHelper::~AssertHelper(&local_5f0);
      testing::Message::~Message((Message *)0x264aa5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x264afd);
    cfd::core::ByteData::GetHex_abi_cxx11_();
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[](&local_560,1)
    ;
    cfd::core::ByteData::GetHex_abi_cxx11_();
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              (in_stack_fffffffffffff928,
               (char *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               in_stack_fffffffffffff918,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
    std::__cxx11::string::~string(local_640);
    std::__cxx11::string::~string(local_620);
    in_stack_fffffffffffff917 = testing::AssertionResult::operator_cast_to_bool(&local_600);
    if (!(bool)in_stack_fffffffffffff917) {
      testing::Message::Message(&local_648);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x264c31);
      testing::internal::AssertHelper::AssertHelper
                (&local_650,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x4f2,pcVar3);
      testing::internal::AssertHelper::operator=(&local_650,&local_648);
      testing::internal::AssertHelper::~AssertHelper(&local_650);
      testing::Message::~Message((Message *)0x264c8c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x264ce1);
  }
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
  cfd::core::ByteData::~ByteData((ByteData *)0x264d0f);
  cfd::core::ByteData::~ByteData((ByteData *)0x264d1c);
  cfd::Psbt::~Psbt((Psbt *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
  cfd::core::ByteData::~ByteData((ByteData *)0x264d36);
  cfd::core::ByteData::~ByteData((ByteData *)0x264d43);
  cfd::core::ByteData::~ByteData((ByteData *)0x264d50);
  cfd::core::ByteData::~ByteData((ByteData *)0x264d5d);
  cfd::Psbt::~Psbt((Psbt *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
  cfd::core::Transaction::~Transaction
            ((Transaction *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
  return;
}

Assistant:

TEST(Psbt, SetGlobalRecordTest) {
  Transaction tx("0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000");
  Psbt psbt(tx);

  ByteData global_key1 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy1");
  ByteData global_value1 = ByteData("01020304");
  ByteData global_key2 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy2");
  ByteData global_value2 = ByteData("00");
  psbt.SetGlobalRecord(global_key1, global_value1);
  EXPECT_TRUE(psbt.IsFindGlobalRecord(global_key1));
  EXPECT_FALSE(psbt.IsFindGlobalRecord(global_key2));
  psbt.SetGlobalRecord(global_key2, global_value2);
  EXPECT_TRUE(psbt.IsFindGlobalRecord(global_key2));

  EXPECT_STREQ("70736274ff01009a0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000dfc03636664000664756d6d793104010203040dfc03636664000664756d6d793201000000000000", psbt.GetData().GetHex().c_str());
  EXPECT_STREQ("cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAAAAAAA==", psbt.GetBase64().c_str());

  Psbt psbt2(psbt.GetData());
  auto get_gval1 = psbt2.GetGlobalRecord(global_key1);
  auto get_gval2 = psbt2.GetGlobalRecord(global_key2);
  EXPECT_EQ(get_gval1.GetHex(), global_value1.GetHex());
  EXPECT_EQ(get_gval2.GetHex(), global_value2.GetHex());

  auto key_list = psbt2.GetGlobalRecordKeyList();
  EXPECT_EQ(2, key_list.size());
  if (key_list.size() == 2) {
    EXPECT_EQ(global_key1.GetHex(), key_list[0].GetHex());
    EXPECT_EQ(global_key2.GetHex(), key_list[1].GetHex());
  }
}